

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

void __thiscall
Assimp::DefaultLogger::WriteToStreams(DefaultLogger *this,char *message,ErrorSeverity ErrorSev)

{
  ErrorSeverity EVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  reference ppLVar5;
  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_38;
  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_30;
  __normal_iterator<Assimp::LogStreamInfo_*const_*,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_28;
  ConstStreamIt it;
  char *pcStack_18;
  ErrorSeverity ErrorSev_local;
  char *message_local;
  DefaultLogger *this_local;
  
  it._M_current._4_4_ = ErrorSev;
  if (message == (char *)0x0) {
    __assert_fail("nullptr != message",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/DefaultLogger.cpp"
                  ,0x173,"void Assimp::DefaultLogger::WriteToStreams(const char *, ErrorSeverity)");
  }
  iVar3 = strncmp(message,this->lastMsg,this->lastLen - 1);
  if (iVar3 == 0) {
    if ((this->noRepeatMsg & 1U) != 0) {
      return;
    }
    this->noRepeatMsg = true;
    pcStack_18 = "Skipping one or more lines with the same contents\n";
  }
  else {
    sVar4 = strlen(message);
    this->lastLen = sVar4;
    memcpy(this->lastMsg,message,this->lastLen + 1);
    strcat(this->lastMsg + this->lastLen,"\n");
    pcStack_18 = this->lastMsg;
    this->noRepeatMsg = false;
    this->lastLen = this->lastLen + 1;
  }
  local_30._M_current =
       (LogStreamInfo **)
       std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::begin
                 (&this->m_StreamArray);
  __gnu_cxx::
  __normal_iterator<Assimp::LogStreamInfo*const*,std::vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>>>
  ::__normal_iterator<Assimp::LogStreamInfo**>
            ((__normal_iterator<Assimp::LogStreamInfo*const*,std::vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>>>
              *)&local_28,&local_30);
  while( true ) {
    local_38._M_current =
         (LogStreamInfo **)
         std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::end
                   (&this->m_StreamArray);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_38);
    EVar1 = it._M_current._4_4_;
    if (!bVar2) break;
    ppLVar5 = __gnu_cxx::
              __normal_iterator<Assimp::LogStreamInfo_*const_*,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
              ::operator*(&local_28);
    if ((EVar1 & (*ppLVar5)->m_uiErrorSeverity) != 0) {
      ppLVar5 = __gnu_cxx::
                __normal_iterator<Assimp::LogStreamInfo_*const_*,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                ::operator*(&local_28);
      (*(*ppLVar5)->m_pStream->_vptr_LogStream[2])((*ppLVar5)->m_pStream,pcStack_18);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::LogStreamInfo_*const_*,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void DefaultLogger::WriteToStreams(const char *message, ErrorSeverity ErrorSev ) {
    ai_assert(nullptr != message);

    // Check whether this is a repeated message
    if (! ::strncmp( message,lastMsg, lastLen-1))
    {
        if (!noRepeatMsg)
        {
            noRepeatMsg = true;
            message = "Skipping one or more lines with the same contents\n";
        }
        else return;
    }
    else
    {
        // append a new-line character to the message to be printed
        lastLen = ::strlen(message);
        ::memcpy(lastMsg,message,lastLen+1);
        ::strcat(lastMsg+lastLen,"\n");

        message = lastMsg;
        noRepeatMsg = false;
        ++lastLen;
    }
    for ( ConstStreamIt it = m_StreamArray.begin();
        it != m_StreamArray.end();
        ++it)
    {
        if ( ErrorSev & (*it)->m_uiErrorSeverity )
            (*it)->m_pStream->write( message);
    }
}